

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg,ImGuiItemFlags extra_flags)

{
  ImGuiItemStatusFlags *pIVar1;
  int *piVar2;
  short *psVar3;
  ImRect *pIVar4;
  ImVec2 IVar5;
  ImGuiNavLayer IVar6;
  ImGuiID IVar7;
  uint uVar8;
  int iVar9;
  ImGuiWindow *pIVar10;
  ImGuiWindow *pIVar11;
  ImGuiContext *pIVar12;
  bool bVar13;
  bool bVar14;
  uint uVar15;
  ImGuiID id_1;
  ImGuiNavItemData *pIVar16;
  ImGuiWindow *window;
  ImGuiContext *g;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  pIVar12 = GImGui;
  pIVar10 = GImGui->CurrentWindow;
  (GImGui->LastItemData).ID = id;
  IVar5 = bb->Max;
  (pIVar12->LastItemData).Rect.Min = bb->Min;
  (pIVar12->LastItemData).Rect.Max = IVar5;
  if (nav_bb_arg == (ImRect *)0x0) {
    nav_bb_arg = bb;
  }
  IVar5 = nav_bb_arg->Max;
  (pIVar12->LastItemData).NavRect.Min = nav_bb_arg->Min;
  (pIVar12->LastItemData).NavRect.Max = IVar5;
  uVar15 = extra_flags | pIVar12->CurrentItemFlags;
  (pIVar12->LastItemData).InFlags = uVar15;
  (pIVar12->LastItemData).StatusFlags = 0;
  if (id == 0) goto LAB_001187c2;
  IVar6 = (pIVar10->DC).NavLayerCurrent;
  psVar3 = &(pIVar10->DC).NavLayersActiveMaskNext;
  *psVar3 = *psVar3 | (ushort)(1 << ((byte)IVar6 & 0x1f));
  IVar7 = pIVar12->NavId;
  if ((((IVar7 != id) && (pIVar12->NavAnyRequest != true)) ||
      (pIVar11 = pIVar12->NavWindow, pIVar11->RootWindowForNav != pIVar10->RootWindowForNav)) ||
     ((pIVar10 != pIVar11 && (((uint)(pIVar11->Flags | pIVar10->Flags) >> 0x17 & 1) == 0))))
  goto LAB_001187c2;
  IVar5 = (pIVar12->LastItemData).NavRect.Min;
  fVar20 = IVar5.x;
  fVar21 = IVar5.y;
  IVar5 = (pIVar12->LastItemData).NavRect.Max;
  fVar22 = IVar5.x;
  fVar23 = IVar5.y;
  bVar13 = pIVar12->NavInitRequest;
  if ((bVar13 == true) && (pIVar12->NavLayer == IVar6)) {
    if ((uVar15 & 0x14) == 0) {
      pIVar12->NavInitResultId = id;
      IVar5 = (pIVar10->DC).CursorStartPos;
      fVar17 = IVar5.x;
      fVar18 = IVar5.y;
      (pIVar12->NavInitResultRectRel).Min.x = fVar20 - fVar17;
      (pIVar12->NavInitResultRectRel).Min.y = fVar21 - fVar18;
      (pIVar12->NavInitResultRectRel).Max.x = fVar22 - fVar17;
      (pIVar12->NavInitResultRectRel).Max.y = fVar23 - fVar18;
LAB_001188b2:
      pIVar12->NavInitRequest = false;
      pIVar12->NavAnyRequest = pIVar12->NavMoveScoringItems;
      bVar13 = false;
    }
    else if (pIVar12->NavInitResultId == 0) {
      pIVar12->NavInitResultId = id;
      IVar5 = (pIVar10->DC).CursorStartPos;
      fVar17 = IVar5.x;
      fVar18 = IVar5.y;
      (pIVar12->NavInitResultRectRel).Min.x = fVar20 - fVar17;
      (pIVar12->NavInitResultRectRel).Min.y = fVar21 - fVar18;
      (pIVar12->NavInitResultRectRel).Max.x = fVar22 - fVar17;
      (pIVar12->NavInitResultRectRel).Max.y = fVar23 - fVar18;
      if ((uVar15 & 0x14) == 0) goto LAB_001188b2;
    }
  }
  if (pIVar12->NavMoveScoringItems == true) {
    uVar8 = pIVar12->NavMoveFlags;
    if ((uVar8 >> 10 & 1) == 0) {
      if ((uVar15 & 0xc) == 0 && ((uVar8 & 0x10) != 0 || IVar7 != id)) {
        pIVar16 = &pIVar12->NavMoveResultOther;
        if (pIVar10 == pIVar11) {
          pIVar16 = &pIVar12->NavMoveResultLocal;
        }
        bVar13 = NavScoreItem(pIVar16);
        if (bVar13) {
          NavApplyItemToResult(pIVar16);
        }
        if ((((pIVar12->NavMoveFlags & 0x20) != 0) &&
            (fVar17 = (pIVar10->ClipRect).Max.y, fVar21 < fVar17)) &&
           ((fVar18 = (pIVar10->ClipRect).Min.y, fVar18 < fVar23 &&
            ((fVar20 < (pIVar10->ClipRect).Max.x &&
             ((pIVar10->ClipRect).Min.x <= fVar22 && fVar22 != (pIVar10->ClipRect).Min.x)))))) {
          fVar19 = fVar17;
          if (fVar23 <= fVar17) {
            fVar19 = fVar23;
          }
          if (fVar21 <= fVar17) {
            fVar17 = fVar21;
          }
          if ((fVar23 - fVar21) * 0.7 <=
              (float)(-(uint)(fVar23 < fVar18) & (uint)fVar18 |
                     ~-(uint)(fVar23 < fVar18) & (uint)fVar19) -
              (float)(-(uint)(fVar21 < fVar18) & (uint)fVar18 |
                     ~-(uint)(fVar21 < fVar18) & (uint)fVar17)) {
            pIVar16 = &pIVar12->NavMoveResultLocalVisible;
            bVar13 = NavScoreItem(pIVar16);
            if (bVar13) goto LAB_00118b5c;
          }
        }
      }
    }
    else if ((uVar15 & 0x105) == 0x100 || (uVar8 >> 9 & 1) != 0) {
      pIVar16 = &pIVar12->NavMoveResultLocal;
      iVar9 = pIVar12->NavTabbingDir;
      if (iVar9 == -1) {
        if (IVar7 == id) {
          if ((pIVar12->NavMoveResultLocal).ID != 0) {
            pIVar12->NavMoveScoringItems = false;
            pIVar12->NavAnyRequest = bVar13;
          }
        }
        else {
LAB_00118b5c:
          NavApplyItemToResult(pIVar16);
        }
      }
      else if (iVar9 == 0) {
        if ((pIVar12->NavTabbingResultFirst).ID == 0) {
          pIVar16 = &pIVar12->NavTabbingResultFirst;
          pIVar12->NavMoveScoringItems = false;
LAB_00118b8b:
          NavApplyItemToResult(pIVar16);
          bVar13 = true;
          if (GImGui->NavMoveScoringItems == false) {
            bVar13 = GImGui->NavInitRequest;
          }
          GImGui->NavAnyRequest = bVar13;
        }
      }
      else if (iVar9 == 1) {
        if ((pIVar12->NavTabbingResultFirst).ID == 0) {
          NavApplyItemToResult(&pIVar12->NavTabbingResultFirst);
        }
        piVar2 = &pIVar12->NavTabbingCounter;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          GImGui->NavMoveScoringItems = false;
          goto LAB_00118b8b;
        }
        if (pIVar12->NavId == id) {
          pIVar12->NavTabbingCounter = 1;
        }
      }
    }
  }
  if (pIVar12->NavId == id) {
    pIVar12->NavWindow = pIVar10;
    IVar6 = (pIVar10->DC).NavLayerCurrent;
    pIVar12->NavLayer = IVar6;
    pIVar12->NavFocusScopeId = (pIVar10->DC).NavFocusScopeIdCurrent;
    pIVar12->NavIdIsAlive = true;
    IVar5 = (pIVar10->DC).CursorStartPos;
    fVar17 = IVar5.x;
    fVar18 = IVar5.y;
    pIVar4 = pIVar10->NavRectRel + IVar6;
    (pIVar4->Min).x = fVar20 - fVar17;
    (pIVar4->Min).y = fVar21 - fVar18;
    (pIVar4->Max).x = fVar22 - fVar17;
    (pIVar4->Max).y = fVar23 - fVar18;
  }
LAB_001187c2:
  (pIVar12->NextItemData).Flags = 0;
  bVar13 = IsClippedEx(bb,id);
  if ((!bVar13) && (bVar14 = IsMouseHoveringRect(&bb->Min,&bb->Max,true), bVar14)) {
    pIVar1 = &(pIVar12->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 1;
  }
  return !bVar13;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg, ImGuiItemFlags extra_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Set item data
    // (DisplayRect is left untouched, made valid when ImGuiItemStatusFlags_HasDisplayRect is set)
    g.LastItemData.ID = id;
    g.LastItemData.Rect = bb;
    g.LastItemData.NavRect = nav_bb_arg ? *nav_bb_arg : bb;
    g.LastItemData.InFlags = g.CurrentItemFlags | extra_flags;
    g.LastItemData.StatusFlags = ImGuiItemStatusFlags_None;

    // Directional navigation processing
    if (id != 0)
    {
        // Runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests
        //      unfortunately, but it is still limited to one window. It may not scale very well for windows with ten of
        //      thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able
        //      to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick).
        // We intentionally don't check if g.NavWindow != NULL because g.NavAnyRequest should only be set when it is non null.
        // If we crash on a NULL g.NavWindow we need to fix the bug elsewhere.
        window->DC.NavLayersActiveMaskNext |= (1 << window->DC.NavLayerCurrent);
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem();

        // [DEBUG] People keep stumbling on this problem and using "" as identifier in the root of a window instead of "##something".
        // Empty identifier are valid and useful in a small amount of cases, but 99.9% of the time you want to use "##something".
        // READ THE FAQ: https://dearimgui.org/faq
        IM_ASSERT(id != window->ID && "Cannot have an empty ID at the root of a window. If you need an empty label, use ## and read the FAQ about how the ID Stack works!");

        // [DEBUG] Item Picker tool, when enabling the "extended" version we perform the check in ItemAdd()
#ifdef IMGUI_DEBUG_TOOL_ITEM_PICKER_EX
        if (id == g.DebugItemPickerBreakId)
        {
            IM_DEBUG_BREAK();
            g.DebugItemPickerBreakId = 0;
        }
#endif
    }
    g.NextItemData.Flags = ImGuiNextItemDataFlags_None;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0)
        IMGUI_TEST_ENGINE_ITEM_ADD(nav_bb_arg ? *nav_bb_arg : bb, id);
#endif

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}